

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

l_mem objsize(GCObject *o)

{
  long local_50;
  TString *ts_1;
  TString *ts;
  Udata *u;
  CClosure *cl_1;
  LClosure *cl;
  lu_mem res;
  GCObject *o_local;
  
  switch(o->tt) {
  case '\x04':
    cl = (LClosure *)((ulong)((int)(char)o->field_0xb + 1) + 0x18);
    break;
  case '\x05':
    cl = (LClosure *)luaH_size((Table *)o);
    break;
  case '\x06':
    cl = (LClosure *)((ulong)(byte)o->field_0xa * 8 + 0x20);
    break;
  case '\a':
    if (*(short *)&o->field_0xa == 0) {
      local_50 = 0x20;
    }
    else {
      local_50 = (ulong)*(ushort *)&o->field_0xa * 0x10 + 0x28;
    }
    cl = (LClosure *)((long)&(o[1].next)->next + local_50);
    break;
  case '\b':
    cl = (LClosure *)luaE_threadsize((lua_State *)o);
    break;
  case '\t':
    cl = (LClosure *)0x28;
    break;
  case '\n':
    cl = (LClosure *)luaF_protosize((Proto *)o);
    break;
  default:
    cl = (LClosure *)0x0;
    break;
  case '\x14':
    cl = (LClosure *)luaS_sizelngstr((size_t)o[1].next,(int)(char)o->field_0xb);
    break;
  case '&':
    cl = (LClosure *)((ulong)(byte)o->field_0xa * 0x10 + 0x20);
  }
  return (l_mem)cl;
}

Assistant:

static l_mem objsize (GCObject *o) {
  lu_mem res;
  switch (o->tt) {
    case LUA_VTABLE: {
      res = luaH_size(gco2t(o));
      break;
    }
    case LUA_VLCL: {
      LClosure *cl = gco2lcl(o);
      res = sizeLclosure(cl->nupvalues);
      break;
    }
    case LUA_VCCL: {
      CClosure *cl = gco2ccl(o);
      res = sizeCclosure(cl->nupvalues);
      break;
      break;
    }
    case LUA_VUSERDATA: {
      Udata *u = gco2u(o);
      res = sizeudata(u->nuvalue, u->len);
      break;
    }
    case LUA_VPROTO: {
      res = luaF_protosize(gco2p(o));
      break;
    }
    case LUA_VTHREAD: {
      res = luaE_threadsize(gco2th(o));
      break;
    }
    case LUA_VSHRSTR: {
      TString *ts = gco2ts(o);
      res = sizestrshr(cast_uint(ts->shrlen));
      break;
    }
    case LUA_VLNGSTR: {
      TString *ts = gco2ts(o);
      res = luaS_sizelngstr(ts->u.lnglen, ts->shrlen);
      break;
    }
    case LUA_VUPVAL: {
      res = sizeof(UpVal);
      break;
    }
    default: res = 0; lua_assert(0);
  }
  return cast(l_mem, res);
}